

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase583::run(TestCase583 *this)

{
  ForkHubBase *this_00;
  code *pcVar1;
  PromiseArena *pPVar2;
  _func_int *p_Var3;
  SourceLocation location;
  undefined8 uVar4;
  PromiseBase PVar5;
  void *pvVar6;
  void *pvVar7;
  TransformPromiseNodeBase *this_01;
  OwnPromiseNode OVar8;
  DebugComparison<int,_int> _kjCondition;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:597:40),_kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>_>
  branch2;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:593:40),_kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>_>
  branch1;
  Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> promise;
  WaitScope waitScope;
  EventLoop loop;
  DebugComparison<int,_int> local_170;
  int local_14c;
  PromiseBase local_148;
  PromiseBase local_140;
  OwnPromiseNode local_138;
  __pid_t local_12c;
  EventLoop *local_128;
  undefined4 local_120;
  long local_118;
  undefined8 uStack_110;
  char *local_108;
  char *pcStack_100;
  undefined8 local_f8;
  char *local_f0;
  char *pcStack_e8;
  undefined8 local_e0;
  char *local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  char *local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  EventLoop local_a8;
  
  EventLoop::EventLoop(&local_a8);
  local_120 = 0xffffffff;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = &local_a8;
  EventLoop::enterScope(&local_a8);
  yield();
  uVar4 = local_170._0_8_;
  pPVar2 = *(PromiseArena **)(local_170._0_8_ + 8);
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_170._0_8_ - (long)pPVar2) < 0x28) {
    pvVar6 = operator_new(0x400);
    this_01 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:587:58)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_006022b0;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    *(PromiseArena **)(local_170._0_8_ + 8) = (PromiseArena *)0x0;
    this_01 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)(local_170._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:587:58)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar4 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006022b0;
    ((PromiseArenaMember *)(uVar4 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  uVar4 = local_170._0_8_;
  local_138.ptr = &this_01->super_PromiseNode;
  if ((PromiseArenaMember *)local_170._0_8_ != (PromiseArenaMember *)0x0) {
    local_170._0_8_ = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
  }
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  local_170.op.content.ptr = "run";
  local_170.op.content.size_ = 0xf0000024f;
  pvVar6 = operator_new(0x400);
  this_00 = (ForkHubBase *)((long)pvVar6 + 0x1d8);
  *(undefined ***)((long)pvVar6 + 0x1d8) = &PTR_destroy_00602308;
  *(undefined ***)((long)pvVar6 + 0x1e8) = &PTR_traceEvent_00602330;
  location.function = local_170.op.content.ptr;
  location.fileName = (char *)local_170._0_8_;
  location.lineNumber = (undefined4)local_170.op.content.size_;
  location.columnNumber = local_170.op.content.size_._4_4_;
  kj::_::ForkHubBase::ForkHubBase
            (this_00,&local_138,(ExceptionOrValue *)((long)pvVar6 + 0x250),location);
  *(undefined ***)((long)pvVar6 + 0x1d8) = &PTR_destroy_00602308;
  *(undefined ***)((long)pvVar6 + 0x1e8) = &PTR_traceEvent_00602330;
  *(undefined1 *)((long)pvVar6 + 0x250) = 0;
  *(undefined1 *)((long)pvVar6 + 1000) = 0;
  *(void **)((long)pvVar6 + 0x1e0) = pvVar6;
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::
  addBranch((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
             *)&local_170);
  uVar4 = local_170._0_8_;
  pPVar2 = *(PromiseArena **)(local_170._0_8_ + 8);
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_170._0_8_ - (long)pPVar2) < 0x28) {
    pvVar7 = operator_new(0x400);
    OVar8.ptr = (PromiseNode *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar8.ptr,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:593:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_006023b8;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    *(PromiseArena **)(local_170._0_8_ + 8) = (PromiseArena *)0x0;
    OVar8.ptr = (PromiseNode *)&((PromiseArenaMember *)(local_170._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar8.ptr,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:593:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar4 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006023b8;
    ((PromiseArenaMember *)(uVar4 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  uVar4 = local_170._0_8_;
  local_140.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar8.ptr;
  if ((PromiseArenaMember *)local_170._0_8_ != (PromiseArenaMember *)0x0) {
    local_170._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
  }
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::
  addBranch((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
             *)&local_170);
  uVar4 = local_170._0_8_;
  pPVar2 = *(PromiseArena **)(local_170._0_8_ + 8);
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_170._0_8_ - (long)pPVar2) < 0x28) {
    pvVar7 = operator_new(0x400);
    OVar8.ptr = (PromiseNode *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar8.ptr,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:597:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602410;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    *(PromiseArena **)(local_170._0_8_ + 8) = (PromiseArena *)0x0;
    OVar8.ptr = (PromiseNode *)&((PromiseArenaMember *)(local_170._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar8.ptr,(OwnPromiseNode *)&local_170,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:597:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar4 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602410;
    ((PromiseArenaMember *)(uVar4 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  uVar4 = local_170._0_8_;
  local_148.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar8.ptr;
  if ((PromiseArenaMember *)local_170._0_8_ != (PromiseArenaMember *)0x0) {
    local_170._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar4);
  }
  p_Var3 = (this_00->super_PromiseArenaMember)._vptr_PromiseArenaMember[-2];
  pcVar1 = (code *)((long)pvVar6 + (long)(p_Var3 + 0x228));
  *(int *)pcVar1 = *(int *)pcVar1 + -1;
  if (*(int *)pcVar1 == 0) {
    kj::_::PromiseDisposer::dispose
              ((PromiseArenaMember *)
               ((long)&(this_00->super_PromiseArenaMember)._vptr_PromiseArenaMember + (long)p_Var3))
    ;
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_b8 = "run";
  local_b0 = 0x290000025e;
  local_170.right = Promise<int>::wait((Promise<int> *)&local_140,&local_128);
  local_170.left = 0x1c8;
  local_170.op.content.ptr = " == ";
  local_170.op.content.size_ = 5;
  local_170.result = local_170.right == 0x1c8;
  if ((!local_170.result) && (kj::_::Debug::minSeverity < 3)) {
    local_14c = 0x1c8;
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_d0 = "run";
    local_c8 = 0x290000025e;
    local_12c = Promise<int>::wait((Promise<int> *)&local_140,&local_128);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x25e,ERROR,
               "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", _kjCondition, 456, branch1.wait(waitScope)"
               ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",&local_170,
               &local_14c,&local_12c);
  }
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_e8 = "run";
  local_e0 = 0x290000025f;
  local_170.right = Promise<int>::wait((Promise<int> *)&local_148,&local_128);
  local_170.left = 0x315;
  local_170.op.content.ptr = " == ";
  local_170.op.content.size_ = 5;
  local_170.result = local_170.right == 0x315;
  if ((!local_170.result) && (kj::_::Debug::minSeverity < 3)) {
    local_14c = 0x315;
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_100 = "run";
    local_f8 = 0x290000025f;
    local_12c = Promise<int>::wait((Promise<int> *)&local_148,&local_128);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x25f,ERROR,
               "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", _kjCondition, 789, branch2.wait(waitScope)"
               ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",&local_170,
               &local_14c,&local_12c);
  }
  PVar5.node.ptr = local_148.node.ptr;
  if (local_148.node.ptr != (PromiseNode *)0x0) {
    local_148.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar5.node.ptr);
  }
  PVar5.node.ptr = local_140.node.ptr;
  if (local_140.node.ptr != (PromiseNode *)0x0) {
    local_140.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar5.node.ptr);
  }
  OVar8.ptr = local_138.ptr;
  if ((TransformPromiseNodeBase *)local_138.ptr != (TransformPromiseNodeBase *)0x0) {
    local_138.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar8.ptr)->super_PromiseArenaMember);
  }
  if (local_118 == 0) {
    EventLoop::leaveScope(local_128);
  }
  EventLoop::~EventLoop(&local_a8);
  return;
}

Assistant:

TEST(Async, ForkMaybeRef) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Maybe<Own<RefcountedInt>>> promise = evalLater([&]() {
    return Maybe<Own<RefcountedInt>>(refcounted<RefcountedInt>(123));
  });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](Maybe<Own<RefcountedInt>>&& i) {
    EXPECT_EQ(123, KJ_REQUIRE_NONNULL(i)->i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](Maybe<Own<RefcountedInt>>&& i) {
    EXPECT_EQ(123, KJ_REQUIRE_NONNULL(i)->i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}